

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

tuple<czh::utils::DiyFp,_czh::utils::DiyFp> * __thiscall
czh::utils::DiyFp::normalized_boundaries
          (tuple<czh::utils::DiyFp,_czh::utils::DiyFp> *__return_storage_ptr__,DiyFp *this)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  DiyFp DVar4;
  DiyFp local_30;
  
  uVar2 = this->f;
  local_30.f = uVar2 * 2 + 1;
  local_30.e = this->e + -1;
  DVar4 = normalize_boundary(&local_30);
  uVar3 = this->f;
  iVar1 = this->e;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Tuple_impl<1UL,_czh::utils::DiyFp>.super__Head_base<1UL,_czh::utils::DiyFp,_false>.
  _M_head_impl.f = DVar4.f;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Tuple_impl<1UL,_czh::utils::DiyFp>.super__Head_base<1UL,_czh::utils::DiyFp,_false>.
  _M_head_impl.e = DVar4.e;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
    super__Tuple_impl<1UL,_czh::utils::DiyFp>.super__Head_base<1UL,_czh::utils::DiyFp,_false>.
    _M_head_impl.field_0xc = local_30._12_4_;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Head_base<0UL,_czh::utils::DiyFp,_false>._M_head_impl.f =
       (uVar3 << (uVar2 == 0x10000000000000) + 1) + -1 <<
       ((~(uVar2 == 0x10000000000000) + (char)iVar1) - (char)DVar4.e & 0x3fU);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Head_base<0UL,_czh::utils::DiyFp,_false>._M_head_impl.e = DVar4.e;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::tuple<DiyFp, DiyFp> normalized_boundaries() const
    {
      DiyFp pl, mi;
      bool significand_is_zero = f == DP_HIDDEN_BIT;
      pl.f = (f << 1) + 1;
      pl.e = e - 1;
      pl = pl.normalize_boundary();
      if (significand_is_zero)
      {
        mi.f = (f << 2) - 1;
        mi.e = e - 2;
      }
      else
      {
        mi.f = (f << 1) - 1;
        mi.e = e - 1;
      }
      mi.f <<= mi.e - pl.e;
      mi.e = pl.e;
      return {mi, pl};
    }